

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_hotplugging.c
# Opt level: O0

void draw(ALLEGRO_JOYSTICK *curr_joy)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long in_RDI;
  undefined8 uVar4;
  float fVar5;
  ulong in_XMM1_Qa;
  float fVar7;
  int i;
  ALLEGRO_JOYSTICK_STATE joystate;
  int y;
  int x;
  int local_154;
  float local_150 [48];
  int aiStack_90 [32];
  int local_10;
  int local_c;
  long local_8;
  ulong uVar6;
  
  local_c = 100;
  local_10 = 100;
  local_8 = in_RDI;
  uVar4 = al_map_rgb(0,0);
  al_clear_to_color(uVar4);
  if (local_8 != 0) {
    al_get_joystick_state(local_8,local_150);
    for (local_154 = 0; iVar3 = al_get_joystick_num_sticks(local_8), local_154 < iVar3;
        local_154 = local_154 + 1) {
      fVar7 = (float)local_c;
      fVar1 = local_150[(long)local_154 * 3];
      fVar2 = local_150[(long)local_154 * 3 + 1];
      fVar5 = (float)local_10;
      uVar6 = (ulong)(uint)fVar5;
      uVar4 = al_map_rgb(0xff,0xff);
      in_XMM1_Qa = (ulong)(uint)(fVar2 * 20.0 + fVar5);
      al_draw_filled_circle
                (fVar1 * 20.0 + fVar7 + (float)(local_154 * 0x50),in_XMM1_Qa,0x41a00000,uVar4,uVar6)
      ;
    }
    for (local_154 = 0; iVar3 = al_get_joystick_num_buttons(local_8), local_154 < iVar3;
        local_154 = local_154 + 1) {
      uVar6 = in_XMM1_Qa;
      if (aiStack_90[local_154] != 0) {
        uVar4 = al_map_rgb(0xff,0xff);
        uVar6 = 0x43c80000;
        al_draw_filled_circle((float)(local_154 * 0x14 + 10),0x43c80000,0x41100000,uVar4,in_XMM1_Qa)
        ;
      }
      in_XMM1_Qa = uVar6;
    }
  }
  al_flip_display();
  return;
}

Assistant:

static void draw(ALLEGRO_JOYSTICK *curr_joy)
{
   int x = 100;
   int y = 100;
   ALLEGRO_JOYSTICK_STATE joystate;
   int i;

   al_clear_to_color(al_map_rgb(0, 0, 0));

   if (curr_joy) {
      al_get_joystick_state(curr_joy, &joystate);
      for (i = 0; i < al_get_joystick_num_sticks(curr_joy); i++) {
         al_draw_filled_circle(
               x+joystate.stick[i].axis[0]*20 + i * 80,
               y+joystate.stick[i].axis[1]*20,
               20, al_map_rgb(255, 255, 255)
            );
      }
      for (i = 0; i < al_get_joystick_num_buttons(curr_joy); i++) {
         if (joystate.button[i]) {
            al_draw_filled_circle(
                  i*20+10, 400, 9, al_map_rgb(255, 255, 255)
                  );
         }
      }
   }

   al_flip_display();
}